

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_heartbeat_tlv(uint64_t *interval,dlep_session *session,dlep_parser_value *value)

{
  uint32_t uVar1;
  uint8_t *ptr;
  dlep_parser_value *pdStack_38;
  uint32_t tmp;
  dlep_parser_value *value_local;
  dlep_session *session_local;
  uint64_t *interval_local;
  
  pdStack_38 = value;
  if ((value == (dlep_parser_value *)0x0) &&
     (pdStack_38 = dlep_session_get_tlv_value(session,5), pdStack_38 == (dlep_parser_value *)0x0)) {
    interval_local._4_4_ = -1;
  }
  else {
    uVar1 = ntohl(*(uint32_t *)((session->parser).tlv_ptr + pdStack_38->index));
    *interval = (ulong)uVar1;
    interval_local._4_4_ = 0;
  }
  return interval_local._4_4_;
}

Assistant:

int
dlep_reader_heartbeat_tlv(uint64_t *interval, struct dlep_session *session, struct dlep_parser_value *value) {
  uint32_t tmp;
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_HEARTBEAT_INTERVAL_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  memcpy(&tmp, ptr, sizeof(tmp));
  *interval = ntohl(tmp);
  return 0;
}